

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O3

int __thiscall
Js::LineOffsetCache::GetLineForCharacterOffset
          (LineOffsetCache *this,charcount_t characterOffset,charcount_t *outLineCharOffset,
          charcount_t *outByteOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint *puVar4;
  int iVar5;
  charcount_t cVar6;
  int iVar7;
  int iVar8;
  charcount_t line;
  int iVar9;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *local_48;
  
  local_48 = (this->lineCharacterOffsetCacheList).ptr;
  iVar9 = local_48->count;
  if (iVar9 < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x3a,"(this->lineCharacterOffsetCacheList->Count() > 0)",
                                "this->lineCharacterOffsetCacheList->Count() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    local_48 = (this->lineCharacterOffsetCacheList).ptr;
    iVar9 = local_48->count;
    if (iVar9 < 1) {
      return -1;
    }
  }
  iVar9 = iVar9 + -1;
  iVar7 = 0;
  line = 0xffffffff;
  iVar8 = 0x7fffffff;
  do {
    cVar6 = (iVar9 - iVar7) / 2 + iVar7;
    puVar4 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Item
                       (local_48,cVar6);
    iVar5 = characterOffset - *puVar4;
    if (iVar5 < 0) {
      iVar9 = cVar6 - 1;
    }
    else {
      if (iVar5 < iVar8) {
        line = cVar6;
        iVar8 = iVar5;
      }
      iVar7 = cVar6 + 1;
    }
  } while (iVar7 <= iVar9);
  if ((-1 < (int)line) &&
     (cVar6 = GetCharacterOffsetForLine(this,line,outByteOffset),
     outLineCharOffset != (charcount_t *)0x0)) {
    *outLineCharOffset = cVar6;
  }
  return line;
}

Assistant:

int LineOffsetCache::GetLineForCharacterOffset(charcount_t characterOffset, charcount_t *outLineCharOffset, charcount_t *outByteOffset)
    {
        Assert(this->lineCharacterOffsetCacheList->Count() > 0);

        // The list is sorted, so binary search to find the line info.
        int closestIndex = -1;
        int minRange = INT_MAX;

        this->lineCharacterOffsetCacheList->BinarySearch([&](const charcount_t item, int index)
        {
            int offsetRange = characterOffset - item;
            if (offsetRange >= 0)
            {
                if (offsetRange < minRange)
                {
                    // There are potentially many lines with starting offsets greater than the one we're searching
                    // for.  As a result, we should track which index we've encountered so far that is the closest
                    // to the offset we're looking for without going under.  This will find the line that contains
                    // the offset.
                    closestIndex = index;
                    minRange = offsetRange;
                }

                // Search lower to see if we can find a closer index.
                return -1;
            }
            else
            {
                // Search higher to get into a range that is greater than the offset.
                return 1;
            }

            // Note that we purposely don't return 0 (==) here.  We want the search to end in failure (-1) because
            // we're searching for the closest element, not necessarily an exact element offset.  Exact offsets
            // are possible when the offset we're searching for is the first character of the line, but that will
            // be handled by the if statement above.
        });

        if (closestIndex >= 0)
        {
            charcount_t lastItemCharacterOffset = GetCharacterOffsetForLine(closestIndex, outByteOffset);

            if (outLineCharOffset != nullptr)
            {
                *outLineCharOffset = lastItemCharacterOffset;
            }
        }

        return closestIndex;
    }